

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1_util.cpp
# Opt level: O0

secp256k1_pubkey * cfd::core::ParsePubkey(secp256k1_pubkey *__return_storage_ptr__,Pubkey *pubkey)

{
  secp256k1_context_struct *ctx_00;
  uchar *input;
  size_type inputlen;
  CfdException *this;
  allocator local_81;
  string local_80;
  int local_5c;
  secp256k1_context_struct *psStack_58;
  int ret;
  secp256k1_context_struct *ctx;
  ByteData local_40;
  undefined1 local_28 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_bytes;
  Pubkey *pubkey_local;
  
  pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pubkey;
  Pubkey::GetData(&local_40,pubkey);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,&local_40);
  ByteData::~ByteData(&local_40);
  ctx_00 = wally_get_secp_context();
  psStack_58 = ctx_00;
  input = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  inputlen = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  local_5c = secp256k1_ec_pubkey_parse(ctx_00,__return_storage_ptr__,input,inputlen);
  if (local_5c != 1) {
    this = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_80,"Secp256k1 pubkey parse error",&local_81);
    CfdException::CfdException(this,kCfdInternalError,&local_80);
    __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  return __return_storage_ptr__;
}

Assistant:

secp256k1_pubkey ParsePubkey(const Pubkey& pubkey) {
  auto pubkey_bytes = pubkey.GetData().GetBytes();
  auto ctx = wally_get_secp_context();
  secp256k1_pubkey result;
  int ret = secp256k1_ec_pubkey_parse(
      ctx, &result, pubkey_bytes.data(), pubkey_bytes.size());
  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Secp256k1 pubkey parse error");
  }

  return result;
}